

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O1

MediumHandle __thiscall
pbrt::MediumHandle::Create
          (MediumHandle *this,string *name,ParameterDictionary *parameters,
          Transform *renderFromMedium,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  NanoVDBMediumProvider *provider;
  GeneralMedium<pbrt::UniformGridMediumProvider> *pGVar2;
  UniformGridMediumProvider *provider_00;
  CloudMediumProvider *provider_01;
  ulong uVar3;
  char *pcVar4;
  
  (this->
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  ).bits = 0;
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    pGVar2 = (GeneralMedium<pbrt::UniformGridMediumProvider> *)
             HomogeneousMedium::Create(parameters,loc,alloc);
    uVar3 = 0x1000000000000;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      provider_00 = UniformGridMediumProvider::Create(parameters,loc,alloc);
      pGVar2 = GeneralMedium<pbrt::UniformGridMediumProvider>::Create
                         (provider_00,parameters,renderFromMedium,loc,alloc);
      uVar3 = 0x2000000000000;
    }
    else {
      pcVar4 = "cloud";
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        provider_01 = CloudMediumProvider::Create(parameters,(FileLoc *)pcVar4,alloc);
        pGVar2 = (GeneralMedium<pbrt::UniformGridMediumProvider> *)
                 GeneralMedium<pbrt::CloudMediumProvider>::Create
                           (provider_01,parameters,renderFromMedium,loc,alloc);
        uVar3 = 0x3000000000000;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 != 0) {
          pcVar4 = "%s: medium unknown.";
          goto LAB_00356a57;
        }
        provider = NanoVDBMediumProvider::Create(parameters,loc,alloc);
        pGVar2 = (GeneralMedium<pbrt::UniformGridMediumProvider> *)
                 GeneralMedium<pbrt::NanoVDBMediumProvider>::Create
                           (provider,parameters,renderFromMedium,loc,alloc);
        uVar3 = 0x4000000000000;
      }
    }
  }
  (this->
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  ).bits = uVar3 | (ulong)pGVar2;
  if (((ulong)pGVar2 & 0xffffffffffff) != 0) {
    ParameterDictionary::ReportUnused(parameters);
    return (MediumHandle)
           (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            )this;
  }
  pcVar4 = "%s: unable to create medium.";
LAB_00356a57:
  ErrorExit<std::__cxx11::string_const&>(loc,pcVar4,name);
}

Assistant:

MediumHandle MediumHandle::Create(const std::string &name,
                                  const ParameterDictionary &parameters,
                                  const Transform &renderFromMedium, const FileLoc *loc,
                                  Allocator alloc) {
    MediumHandle m = nullptr;
    if (name == "homogeneous")
        m = HomogeneousMedium::Create(parameters, loc, alloc);
    else if (name == "uniformgrid") {
        UniformGridMediumProvider *provider =
            UniformGridMediumProvider::Create(parameters, loc, alloc);
        m = GeneralMedium<UniformGridMediumProvider>::Create(
            provider, parameters, renderFromMedium, loc, alloc);
    } else if (name == "cloud") {
        CloudMediumProvider *provider =
            CloudMediumProvider::Create(parameters, loc, alloc);
        m = GeneralMedium<CloudMediumProvider>::Create(provider, parameters,
                                                       renderFromMedium, loc, alloc);
    } else if (name == "nanovdb") {
        NanoVDBMediumProvider *provider =
            NanoVDBMediumProvider::Create(parameters, loc, alloc);
        m = GeneralMedium<NanoVDBMediumProvider>::Create(provider, parameters,
                                                         renderFromMedium, loc, alloc);
    } else
        ErrorExit(loc, "%s: medium unknown.", name);

    if (!m)
        ErrorExit(loc, "%s: unable to create medium.", name);

    parameters.ReportUnused();
    return m;
}